

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O2

vector<DevMap> *
anon_unknown.dwarf_239414::probe_devices
          (vector<DevMap> *__return_storage_ptr__,snd_pcm_stream_t stream)

{
  pointer pDVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  char cVar8;
  int dev;
  int card;
  vector<DevMap> *local_150;
  allocator local_141;
  snd_pcm_info_t *pcminfo;
  ulong local_138;
  snd_ctl_t *handle;
  string spec;
  string local_108 [8];
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  snd_ctl_card_info_t *info;
  uint local_dc;
  string name;
  string device;
  string main_prefix;
  string device_prefix;
  string card_prefix;
  
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150 = __return_storage_ptr__;
  (*(anonymous_namespace)::psnd_ctl_card_info_malloc)(&info);
  (*(anonymous_namespace)::psnd_pcm_info_malloc)(&pcminfo);
  std::__cxx11::string::string((string *)&spec,"ALSA Default",(allocator *)&main_prefix);
  pcVar7 = "capture";
  if (stream == SND_PCM_STREAM_PLAYBACK) {
    pcVar7 = "device";
  }
  pcVar7 = GetConfigValue((char *)0x0,"alsa",pcVar7,"default");
  std::__cxx11::string::string(local_108,pcVar7,(allocator *)&name);
  std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
  emplace_back<(anonymous_namespace)::DevMap>(local_150,(DevMap *)&spec);
  DevMap::~DevMap((DevMap *)&spec);
  pcVar7 = "custom-captures";
  if (stream == SND_PCM_STREAM_PLAYBACK) {
    pcVar7 = "custom-devices";
  }
  pcVar7 = GetConfigValue((char *)0x0,"alsa",pcVar7,(char *)(AlsaPlayback::reset::channellist + 4));
  while ((pcVar7 != (char *)0x0 && (*pcVar7 != '\0'))) {
    pcVar4 = strchr(pcVar7,0x3b);
    pcVar5 = strchr(pcVar7,0x3d);
    if (pcVar5 == (char *)0x0) {
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::string((string *)&spec,pcVar7,(allocator *)&main_prefix);
        pcVar7 = (char *)0x0;
      }
      else {
        spec._M_dataplus._M_p = (pointer)&spec.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&spec,pcVar7,pcVar4);
        pcVar7 = pcVar4 + 1;
      }
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Invalid ALSA device specification \"%s\"\n",
                spec._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&spec);
    }
    else {
      spec._M_dataplus._M_p = (pointer)&spec.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&spec,pcVar7,pcVar5);
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::string(local_108,pcVar5 + 1,&local_141);
        pcVar7 = (char *)0x0;
      }
      else {
        local_108 = (string  [8])&local_f8;
        std::__cxx11::string::_M_construct<char_const*>(local_108,pcVar5 + 1,pcVar4);
        pcVar7 = pcVar4 + 1;
      }
      std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
      ::emplace_back<(anonymous_namespace)::DevMap>(local_150,(DevMap *)&spec);
      DevMap::~DevMap((DevMap *)&spec);
      if (2 < (int)gLogLevel) {
        pDVar1 = (local_150->
                 super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        fprintf((FILE *)gLogFile,"[ALSOFT] (II) Got device \"%s\", \"%s\"\n",
                pDVar1[-1].name._M_dataplus._M_p,pDVar1[-1].device_name._M_dataplus._M_p);
      }
    }
  }
  pcVar7 = prefix_name(stream);
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&spec,(char *)0x0,"alsa",pcVar7);
  al::optional<std::__cxx11::string>::value_or<char_const(&)[8]>
            (&main_prefix,(optional<std::__cxx11::string> *)&spec,(char (*) [8])"plughw:");
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&spec);
  card = -1;
  iVar3 = (*(anonymous_namespace)::psnd_card_next)();
  while ((pFVar2 = gLogFile, -1 < iVar3 && (-1 < card))) {
    std::__cxx11::to_string(&spec,card);
    std::operator+(&name,"hw:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec);
    std::__cxx11::string::~string((string *)&spec);
    iVar3 = (*(anonymous_namespace)::psnd_ctl_open)(&handle,name._M_dataplus._M_p,0);
    pFVar2 = gLogFile;
    if (iVar3 < 0) {
      if (0 < (int)gLogLevel) {
        local_138 = CONCAT44(local_138._4_4_,card);
        uVar6 = (*(anonymous_namespace)::psnd_strerror)(iVar3);
        fprintf((FILE *)pFVar2,"[ALSOFT] (EE) control open (hw:%d): %s\n",local_138 & 0xffffffff,
                uVar6);
      }
    }
    else {
      iVar3 = (*(anonymous_namespace)::psnd_ctl_card_info)(handle,info);
      pFVar2 = gLogFile;
      if (iVar3 < 0) {
        if (0 < (int)gLogLevel) {
          local_138 = CONCAT44(local_138._4_4_,card);
          uVar6 = (*(anonymous_namespace)::psnd_strerror)(iVar3);
          fprintf((FILE *)pFVar2,"[ALSOFT] (EE) control hardware info (hw:%d): %s\n",
                  local_138 & 0xffffffff,uVar6);
        }
        (*(anonymous_namespace)::psnd_ctl_close)(handle);
      }
      else {
        local_138 = (*(anonymous_namespace)::psnd_ctl_card_info_get_name)(info);
        (*(anonymous_namespace)::psnd_ctl_card_info_get_id)(info);
        prefix_name(stream);
        std::__cxx11::string::assign((char *)&name);
        cVar8 = (char)&name;
        std::__cxx11::string::push_back(cVar8);
        std::__cxx11::string::append((char *)&name);
        ConfigValueStr_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&spec,(char *)0x0,"alsa",name._M_dataplus._M_p);
        al::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
                  (&card_prefix,(optional<std::__cxx11::string> *)&spec,&main_prefix);
        al::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&spec);
        dev = -1;
        while( true ) {
          iVar3 = (*(anonymous_namespace)::psnd_ctl_pcm_next_device)(handle,&dev);
          if ((iVar3 < 0) && (0 < (int)gLogLevel)) {
            fwrite("[ALSOFT] (EE) snd_ctl_pcm_next_device failed\n",0x2d,1,(FILE *)gLogFile);
          }
          if (dev < 0) break;
          (*(anonymous_namespace)::psnd_pcm_info_set_device)(pcminfo);
          (*(anonymous_namespace)::psnd_pcm_info_set_subdevice)(pcminfo,0);
          (*(anonymous_namespace)::psnd_pcm_info_set_stream)(pcminfo,stream);
          iVar3 = (*(anonymous_namespace)::psnd_ctl_pcm_info)(handle,pcminfo);
          pFVar2 = gLogFile;
          if (iVar3 < 0) {
            if ((iVar3 != -2) && (0 < (int)gLogLevel)) {
              local_dc = card;
              uVar6 = (*(anonymous_namespace)::psnd_strerror)(iVar3);
              fprintf((FILE *)pFVar2,"[ALSOFT] (EE) control digital audio info (hw:%d): %s\n",
                      (ulong)local_dc,uVar6);
            }
          }
          else {
            prefix_name(stream);
            std::__cxx11::string::assign((char *)&name);
            std::__cxx11::string::push_back(cVar8);
            std::__cxx11::string::append((char *)&name);
            std::__cxx11::string::push_back(cVar8);
            std::__cxx11::to_string(&spec,dev);
            std::__cxx11::string::append((string *)&name);
            std::__cxx11::string::~string((string *)&spec);
            ConfigValueStr_abi_cxx11_
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&spec,(char *)0x0,"alsa",name._M_dataplus._M_p);
            al::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
                      (&device_prefix,(optional<std::__cxx11::string> *)&spec,&card_prefix);
            al::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&spec);
            std::__cxx11::string::assign((char *)&name);
            std::__cxx11::string::append((char *)&name);
            (*(anonymous_namespace)::psnd_pcm_info_get_name)(pcminfo);
            std::__cxx11::string::append((char *)&name);
            std::__cxx11::string::append((char *)&name);
            std::__cxx11::string::append((char *)&name);
            std::__cxx11::string::append((char *)&name);
            std::__cxx11::to_string(&spec,dev);
            std::__cxx11::string::append((string *)&name);
            std::__cxx11::string::~string((string *)&spec);
            std::__cxx11::string::push_back(cVar8);
            std::__cxx11::string::string((string *)&device,(string *)&device_prefix);
            std::__cxx11::string::append((char *)&device);
            std::__cxx11::string::append((char *)&device);
            std::__cxx11::string::append((char *)&device);
            std::__cxx11::to_string(&spec,dev);
            std::__cxx11::string::append((string *)&device);
            std::__cxx11::string::~string((string *)&spec);
            spec._M_dataplus._M_p = (pointer)&spec.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p == &name.field_2) {
              spec.field_2._8_8_ = name.field_2._8_8_;
            }
            else {
              spec._M_dataplus = name._M_dataplus;
            }
            spec.field_2._M_allocated_capacity._1_7_ = name.field_2._M_allocated_capacity._1_7_;
            spec.field_2._M_local_buf[0] = name.field_2._M_local_buf[0];
            spec._M_string_length = name._M_string_length;
            name._M_string_length = 0;
            name.field_2._M_local_buf[0] = '\0';
            local_108 = (string  [8])&local_f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)device._M_dataplus._M_p == &device.field_2) {
              local_f8._8_8_ = device.field_2._8_8_;
            }
            else {
              local_108 = (string  [8])device._M_dataplus._M_p;
            }
            local_f8._M_allocated_capacity._1_7_ = device.field_2._M_allocated_capacity._1_7_;
            local_f8._M_local_buf[0] = device.field_2._M_local_buf[0];
            local_100 = device._M_string_length;
            device._M_string_length = 0;
            device.field_2._M_local_buf[0] = '\0';
            name._M_dataplus._M_p = (pointer)&name.field_2;
            device._M_dataplus._M_p = (pointer)&device.field_2;
            std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::emplace_back<(anonymous_namespace)::DevMap>(local_150,(DevMap *)&spec);
            DevMap::~DevMap((DevMap *)&spec);
            if (2 < (int)gLogLevel) {
              pDVar1 = (local_150->
                       super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              fprintf((FILE *)gLogFile,"[ALSOFT] (II) Got device \"%s\", \"%s\"\n",
                      pDVar1[-1].name._M_dataplus._M_p,pDVar1[-1].device_name._M_dataplus._M_p);
            }
            std::__cxx11::string::~string((string *)&device);
            std::__cxx11::string::~string((string *)&device_prefix);
          }
        }
        (*(anonymous_namespace)::psnd_ctl_close)(handle);
        std::__cxx11::string::~string((string *)&card_prefix);
      }
    }
    std::__cxx11::string::~string((string *)&name);
    iVar3 = (*(anonymous_namespace)::psnd_card_next)(&card);
  }
  if ((iVar3 < 0) && (0 < (int)gLogLevel)) {
    uVar6 = (*(anonymous_namespace)::psnd_strerror)(iVar3);
    fprintf((FILE *)pFVar2,"[ALSOFT] (EE) snd_card_next failed: %s\n",uVar6);
  }
  (*(anonymous_namespace)::psnd_pcm_info_free)(pcminfo);
  (*(anonymous_namespace)::psnd_ctl_card_info_free)(info);
  std::__cxx11::string::~string((string *)&main_prefix);
  return local_150;
}

Assistant:

al::vector<DevMap> probe_devices(snd_pcm_stream_t stream)
{
    al::vector<DevMap> devlist;

    snd_ctl_card_info_t *info;
    snd_ctl_card_info_malloc(&info);
    snd_pcm_info_t *pcminfo;
    snd_pcm_info_malloc(&pcminfo);

    devlist.emplace_back(DevMap{alsaDevice,
        GetConfigValue(nullptr, "alsa", (stream==SND_PCM_STREAM_PLAYBACK) ? "device" : "capture",
            "default")});

    const char *customdevs{GetConfigValue(nullptr, "alsa",
        (stream == SND_PCM_STREAM_PLAYBACK) ? "custom-devices" : "custom-captures", "")};
    while(const char *curdev{customdevs})
    {
        if(!curdev[0]) break;
        customdevs = strchr(curdev, ';');
        const char *sep{strchr(curdev, '=')};
        if(!sep)
        {
            std::string spec{customdevs ? std::string(curdev, customdevs++) : std::string(curdev)};
            ERR("Invalid ALSA device specification \"%s\"\n", spec.c_str());
            continue;
        }

        const char *oldsep{sep++};
        devlist.emplace_back(DevMap{std::string(curdev, oldsep),
            customdevs ? std::string(sep, customdevs++) : std::string(sep)});
        const auto &entry = devlist.back();
        TRACE("Got device \"%s\", \"%s\"\n", entry.name.c_str(), entry.device_name.c_str());
    }

    const std::string main_prefix{
        ConfigValueStr(nullptr, "alsa", prefix_name(stream)).value_or("plughw:")};

    int card{-1};
    int err{snd_card_next(&card)};
    for(;err >= 0 && card >= 0;err = snd_card_next(&card))
    {
        std::string name{"hw:" + std::to_string(card)};

        snd_ctl_t *handle;
        if((err=snd_ctl_open(&handle, name.c_str(), 0)) < 0)
        {
            ERR("control open (hw:%d): %s\n", card, snd_strerror(err));
            continue;
        }
        if((err=snd_ctl_card_info(handle, info)) < 0)
        {
            ERR("control hardware info (hw:%d): %s\n", card, snd_strerror(err));
            snd_ctl_close(handle);
            continue;
        }

        const char *cardname{snd_ctl_card_info_get_name(info)};
        const char *cardid{snd_ctl_card_info_get_id(info)};
        name = prefix_name(stream);
        name += '-';
        name += cardid;
        const std::string card_prefix{
            ConfigValueStr(nullptr, "alsa", name.c_str()).value_or(main_prefix)};

        int dev{-1};
        while(1)
        {
            if(snd_ctl_pcm_next_device(handle, &dev) < 0)
                ERR("snd_ctl_pcm_next_device failed\n");
            if(dev < 0) break;

            snd_pcm_info_set_device(pcminfo, static_cast<ALuint>(dev));
            snd_pcm_info_set_subdevice(pcminfo, 0);
            snd_pcm_info_set_stream(pcminfo, stream);
            if((err=snd_ctl_pcm_info(handle, pcminfo)) < 0)
            {
                if(err != -ENOENT)
                    ERR("control digital audio info (hw:%d): %s\n", card, snd_strerror(err));
                continue;
            }

            /* "prefix-cardid-dev" */
            name = prefix_name(stream);
            name += '-';
            name += cardid;
            name += '-';
            name += std::to_string(dev);
            const std::string device_prefix{
                ConfigValueStr(nullptr, "alsa", name.c_str()).value_or(card_prefix)};

            /* "CardName, PcmName (CARD=cardid,DEV=dev)" */
            name = cardname;
            name += ", ";
            name += snd_pcm_info_get_name(pcminfo);
            name += " (CARD=";
            name += cardid;
            name += ",DEV=";
            name += std::to_string(dev);
            name += ')';

            /* "devprefixCARD=cardid,DEV=dev" */
            std::string device{device_prefix};
            device += "CARD=";
            device += cardid;
            device += ",DEV=";
            device += std::to_string(dev);
            
            devlist.emplace_back(DevMap{std::move(name), std::move(device)});
            const auto &entry = devlist.back();
            TRACE("Got device \"%s\", \"%s\"\n", entry.name.c_str(), entry.device_name.c_str());
        }
        snd_ctl_close(handle);
    }
    if(err < 0)
        ERR("snd_card_next failed: %s\n", snd_strerror(err));

    snd_pcm_info_free(pcminfo);
    snd_ctl_card_info_free(info);

    return devlist;
}